

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O0

void deqp::gls::Functional::(anonymous_namespace)::clearEdges<tcu::Vector<int,4>>
               (PixelBufferAccess *access,Vector<int,_4> *color,IVec4 *scissorArea)

{
  int iVar1;
  int iVar2;
  undefined4 local_28;
  undefined4 local_24;
  int x;
  int y;
  IVec4 *scissorArea_local;
  Vector<int,_4> *color_local;
  PixelBufferAccess *access_local;
  
  local_24 = 0;
  do {
    iVar1 = tcu::ConstPixelBufferAccess::getHeight(&access->super_ConstPixelBufferAccess);
    if (iVar1 <= local_24) {
      return;
    }
    local_28 = 0;
    while( true ) {
      iVar1 = tcu::ConstPixelBufferAccess::getWidth(&access->super_ConstPixelBufferAccess);
      if (iVar1 <= local_28) break;
      iVar1 = tcu::Vector<int,_4>::y(scissorArea);
      if (local_24 < iVar1) {
LAB_0267634c:
        tcu::PixelBufferAccess::setPixel(access,color,local_28,local_24,0);
      }
      else {
        iVar1 = tcu::Vector<int,_4>::y(scissorArea);
        iVar2 = tcu::Vector<int,_4>::w(scissorArea);
        if (iVar1 + iVar2 <= local_24) goto LAB_0267634c;
        iVar1 = tcu::Vector<int,_4>::x(scissorArea);
        if (local_28 < iVar1) goto LAB_0267634c;
        iVar1 = tcu::Vector<int,_4>::x(scissorArea);
        iVar2 = tcu::Vector<int,_4>::z(scissorArea);
        if (iVar1 + iVar2 <= local_28) goto LAB_0267634c;
      }
      local_28 = local_28 + 1;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void clearEdges (const tcu::PixelBufferAccess& access, const T& color, const IVec4& scissorArea)
{
	for (int y = 0; y < access.getHeight(); y++)
	for (int x = 0; x < access.getWidth(); x++)
	{
		if (y < scissorArea.y() ||
			y >= scissorArea.y() + scissorArea.w() ||
			x < scissorArea.x() ||
			x >= scissorArea.x()+ scissorArea.z())
			access.setPixel(color, x, y);
	}
}